

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pragmaVtabOpen(sqlite3_vtab *pVtab,sqlite3_vtab_cursor **ppCursor)

{
  int iVar1;
  sqlite3_vtab_cursor *psVar2;
  
  psVar2 = (sqlite3_vtab_cursor *)sqlite3_malloc(0x28);
  if (psVar2 == (sqlite3_vtab_cursor *)0x0) {
    iVar1 = 7;
  }
  else {
    psVar2->pVtab = (sqlite3_vtab *)0x0;
    psVar2[1].pVtab = (sqlite3_vtab *)0x0;
    psVar2[4].pVtab = (sqlite3_vtab *)0x0;
    psVar2[2].pVtab = (sqlite3_vtab *)0x0;
    psVar2[3].pVtab = (sqlite3_vtab *)0x0;
    psVar2->pVtab = pVtab;
    *ppCursor = psVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int pragmaVtabOpen(sqlite3_vtab *pVtab, sqlite3_vtab_cursor **ppCursor){
  PragmaVtabCursor *pCsr;
  pCsr = (PragmaVtabCursor*)sqlite3_malloc(sizeof(*pCsr));
  if( pCsr==0 ) return SQLITE_NOMEM;
  memset(pCsr, 0, sizeof(PragmaVtabCursor));
  pCsr->base.pVtab = pVtab;
  *ppCursor = &pCsr->base;
  return SQLITE_OK;
}